

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

OneOf<kj::CompressionParameters,_kj::Exception> * __thiscall
kj::_::tryParseExtensionAgreement
          (OneOf<kj::CompressionParameters,_kj::Exception> *__return_storage_ptr__,_ *this,
          Maybe<kj::CompressionParameters> *clientOffer,StringPtr agreedParameters)

{
  bool bVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  char (*params_1) [62];
  char (*params_1_00) [84];
  char delim;
  Array<char> *pAVar3;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  undefined1 local_288 [8];
  anon_union_40_1_a8c68091_for_NullableValue<kj::CompressionParameters>_2 local_280;
  StringPtr FAILURE;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> offers;
  StringPtr EXPECT;
  Array<char> local_1d0;
  Exception e;
  
  FAILURE.content.ptr = "Server failed WebSocket handshake: ";
  FAILURE.content.size_ = 0x24;
  Debug::makeDescription<>((String *)&local_1d0,"");
  params_1 = (char (*) [62])0x148f;
  pAVar3 = &local_1d0;
  Exception::Exception
            (&e,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x148f,(String *)&local_1d0);
  delim = (char)pAVar3;
  Array<char>::~Array(&local_1d0);
  if (*this == (_)0x0) {
    str<kj::StringPtr_const&,char_const(&)[62]>
              ((String *)local_288,(kj *)&FAILURE,
               (StringPtr *)"added Sec-WebSocket-Extensions when client did not offer any.",params_1
              );
    Array<char>::operator=(&e.description.content,(Array<char> *)local_288);
    Array<char>::~Array((Array<char> *)local_288);
    OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
              ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,&e);
    goto LAB_00364c90;
  }
  input.size_ = 0x2c;
  input.ptr = agreedParameters.content.ptr + -1;
  splitParts(&offers,(_ *)clientOffer,input,delim);
  if ((StringPtr *)((long)offers.builder.pos - (long)offers.builder.ptr) == (StringPtr *)0x10) {
    params_1_00 = (char (*) [84])0x3b;
    input_00.size_ = 0x3b;
    input_00.ptr = (char *)(offers.builder.ptr)->size_;
    splitParts(&splitOffer,(_ *)(offers.builder.ptr)->ptr,input_00,delim);
    local_288 = (undefined1  [8])0x4d4457;
    local_280._0_8_ = 0x12;
    bVar1 = ArrayPtr<const_char>::operator==
                      (splitOffer.builder.ptr,(ArrayPtr<const_char> *)local_288);
    if (bVar1) {
      tryExtractParameters((Maybe<kj::CompressionParameters> *)&EXPECT,&splitOffer,true);
      NullableValue<kj::CompressionParameters>::NullableValue
                ((NullableValue<kj::CompressionParameters> *)local_288,
                 (NullableValue<kj::CompressionParameters> *)&EXPECT);
      if (local_288[0] != (_)0x1) {
        str<kj::StringPtr_const&,char_const(&)[79]>
                  ((String *)local_288,(kj *)&FAILURE,
                   (StringPtr *)
                   "the Sec-WebSocket-Extensions header in the Response included an invalid value.",
                   (char (*) [79])params_1_00);
        Array<char>::operator=(&e.description.content,(Array<char> *)local_288);
        goto LAB_00364c2e;
      }
      if (*this == (_)0x0) {
        Debug::Fault::Fault((Fault *)&EXPECT,
                            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                            ,0x14a9,FAILED,"clientOffer != nullptr","");
        Debug::Fault::fatal((Fault *)&EXPECT);
      }
      if (local_280.value.outboundMaxWindowBits.ptr.isSet == false) {
        if (((_ *)local_288 != this) && (this[0x10] == (_)0x1)) {
          aVar2 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 0x18);
          goto LAB_00364c58;
        }
      }
      else if ((this[0x10] == (_)0x1) &&
              (aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
                       ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this + 0x18))
                       ->value,
              aVar2.value < (ulong)local_280.value.outboundMaxWindowBits.ptr.field_1)) {
LAB_00364c58:
        local_280.value.outboundMaxWindowBits.ptr.isSet = true;
        local_280.value.outboundMaxWindowBits.ptr.field_1 = aVar2;
      }
      if (local_280.value.outboundNoContextTakeover == false) {
        local_280.value.outboundNoContextTakeover = (bool)this[8];
      }
      OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::CompressionParameters,int>
                ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,
                 &local_280.value);
    }
    else {
      str<kj::StringPtr_const&,char_const(&)[84]>
                ((String *)local_288,(kj *)&FAILURE,
                 (StringPtr *)
                 "response included a Sec-WebSocket-Extensions value that was not permessage-deflate."
                 ,params_1_00);
      Array<char>::operator=(&e.description.content,(Array<char> *)local_288);
LAB_00364c2e:
      Array<char>::~Array((Array<char> *)local_288);
      OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
                ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,&e);
    }
    ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&splitOffer.builder);
  }
  else {
    EXPECT.content.ptr =
         "expected exactly one extension (permessage-deflate) but received more than one.";
    EXPECT.content.size_ = 0x50;
    str<kj::StringPtr_const&,kj::StringPtr_const&>
              ((String *)local_288,(kj *)&FAILURE,&EXPECT,
               (StringPtr *)((long)offers.builder.pos - (long)offers.builder.ptr));
    Array<char>::operator=(&e.description.content,(Array<char> *)local_288);
    Array<char>::~Array((Array<char> *)local_288);
    OneOf<kj::CompressionParameters,kj::Exception>::OneOf<kj::Exception,int>
              ((OneOf<kj::CompressionParameters,kj::Exception> *)__return_storage_ptr__,&e);
  }
  ArrayBuilder<kj::ArrayPtr<const_char>_>::dispose(&offers.builder);
LAB_00364c90:
  Exception::~Exception(&e);
  return __return_storage_ptr__;
}

Assistant:

kj::OneOf<CompressionParameters, kj::Exception> tryParseExtensionAgreement(
    const Maybe<CompressionParameters>& clientOffer,
    StringPtr agreedParameters) {
  // Like `tryParseExtensionOffers`, but called by the client when parsing the server's Response.
  // If the client must decline the agreement, we want to provide some details about what went wrong
  // (since the client has to fail the connection).
  constexpr auto FAILURE = "Server failed WebSocket handshake: "_kj;
  auto e = KJ_EXCEPTION(FAILED);

  if (clientOffer == kj::none) {
    // We've received extensions when we did not send any in the first place.
    e.setDescription(
        kj::str(FAILURE, "added Sec-WebSocket-Extensions when client did not offer any."));
    return kj::mv(e);
  }

  auto offers = splitParts(agreedParameters, ',');
  if (offers.size() != 1) {
    constexpr auto EXPECT = "expected exactly one extension (permessage-deflate) but received "
                            "more than one."_kj;
    e.setDescription(kj::str(FAILURE, EXPECT));
    return kj::mv(e);
  }
  auto splitOffer = splitParts(offers.front(), ';');

  if (splitOffer.front() != "permessage-deflate"_kj) {
    e.setDescription(kj::str(FAILURE, "response included a Sec-WebSocket-Extensions value that was "
                                      "not permessage-deflate."));
    return kj::mv(e);
  }

  // Verify the parameters of our single extension, and compare it with the clients original offer.
  KJ_IF_SOME(config, tryExtractParameters(splitOffer, true)) {
    const auto& client = KJ_ASSERT_NONNULL(clientOffer);
    // The server might have ignored the client's hints regarding its compressor's configuration.
    // That's fine, but as the client, we still want to use those outbound compression parameters.
    if (config.outboundMaxWindowBits == kj::none) {
      config.outboundMaxWindowBits = client.outboundMaxWindowBits;
    } else KJ_IF_SOME(value, client.outboundMaxWindowBits) {
      if (value < KJ_ASSERT_NONNULL(config.outboundMaxWindowBits)) {
        // If the client asked for a value smaller than what the server responded with, use the
        // value that the client originally specified.
        config.outboundMaxWindowBits = value;
      }
    }
    if (config.outboundNoContextTakeover == false) {
      config.outboundNoContextTakeover = client.outboundNoContextTakeover;
    }
    return kj::mv(config);
  }

  // There was a problem parsing the server's `Sec-WebSocket-Extensions` response.
  e.setDescription(kj::str(FAILURE, "the Sec-WebSocket-Extensions header in the Response included "
      "an invalid value."));
  return kj::mv(e);
}